

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.h
# Opt level: O2

size_t duckdb_zstd::BIT_initDStream(BIT_DStream_t *bitD,void *srcBuffer,size_t srcSize)

{
  byte bVar1;
  uint uVar2;
  BitContainerType *pBVar3;
  ulong uVar4;
  
  if (srcSize == 0) {
    bitD->ptr = (char *)0x0;
    bitD->start = (char *)0x0;
    bitD->bitContainer = 0;
    *(undefined8 *)&bitD->bitsConsumed = 0;
    bitD->limitPtr = (char *)0x0;
    return 0xffffffffffffffb8;
  }
  bitD->start = (char *)srcBuffer;
  bitD->limitPtr = (char *)((long)srcBuffer + 8);
  if (srcSize < 8) {
    bitD->ptr = (char *)srcBuffer;
    uVar4 = (ulong)*srcBuffer;
    bitD->bitContainer = uVar4;
    switch(srcSize) {
    case 7:
      uVar4 = uVar4 | (ulong)*(byte *)((long)srcBuffer + 6) << 0x30;
      bitD->bitContainer = uVar4;
    case 6:
      uVar4 = uVar4 + ((ulong)*(byte *)((long)srcBuffer + 5) << 0x28);
      bitD->bitContainer = uVar4;
    case 5:
      uVar4 = uVar4 + ((ulong)*(byte *)((long)srcBuffer + 4) << 0x20);
      bitD->bitContainer = uVar4;
    case 4:
      uVar4 = uVar4 + (ulong)*(byte *)((long)srcBuffer + 3) * 0x1000000;
      bitD->bitContainer = uVar4;
    case 3:
      uVar4 = uVar4 + (ulong)*(byte *)((long)srcBuffer + 2) * 0x10000;
      bitD->bitContainer = uVar4;
    case 2:
      bitD->bitContainer = (ulong)*(byte *)((long)srcBuffer + 1) * 0x100 + uVar4;
    }
    bVar1 = *(byte *)((long)srcBuffer + (srcSize - 1));
    if (bVar1 == 0) {
      bitD->bitsConsumed = 0;
      return 0xffffffffffffffec;
    }
    uVar2 = 0x1f;
    if (bVar1 != 0) {
      for (; bVar1 >> uVar2 == 0; uVar2 = uVar2 - 1) {
      }
    }
    uVar2 = (uVar2 ^ 0x1f) + (int)srcSize * -8 + 0x29;
  }
  else {
    pBVar3 = (BitContainerType *)((long)srcBuffer + (srcSize - 8));
    bitD->ptr = (char *)pBVar3;
    bitD->bitContainer = *pBVar3;
    bVar1 = *(byte *)((long)srcBuffer + (srcSize - 1));
    if (bVar1 == 0) {
      bitD->bitsConsumed = 0;
      return 0xffffffffffffffff;
    }
    uVar2 = 0x1f;
    if (bVar1 != 0) {
      for (; bVar1 >> uVar2 == 0; uVar2 = uVar2 - 1) {
      }
    }
    uVar2 = ~uVar2 + 9;
  }
  bitD->bitsConsumed = uVar2;
  return srcSize;
}

Assistant:

MEM_STATIC size_t BIT_initDStream(BIT_DStream_t* bitD, const void* srcBuffer, size_t srcSize)
{
    if (srcSize < 1) { ZSTD_memset(bitD, 0, sizeof(*bitD)); return ERROR(srcSize_wrong); }

    bitD->start = (const char*)srcBuffer;
    bitD->limitPtr = bitD->start + sizeof(bitD->bitContainer);

    if (srcSize >=  sizeof(bitD->bitContainer)) {  /* normal case */
        bitD->ptr   = (const char*)srcBuffer + srcSize - sizeof(bitD->bitContainer);
        bitD->bitContainer = MEM_readLEST(bitD->ptr);
        { BYTE const lastByte = ((const BYTE*)srcBuffer)[srcSize-1];
          bitD->bitsConsumed = lastByte ? 8 - ZSTD_highbit32(lastByte) : 0;  /* ensures bitsConsumed is always set */
          if (lastByte == 0) return ERROR(GENERIC); /* endMark not present */ }
    } else {
        bitD->ptr   = bitD->start;
        bitD->bitContainer = *(const BYTE*)(bitD->start);
        switch(srcSize)
        {
        case 7: bitD->bitContainer += (BitContainerType)(((const BYTE*)(srcBuffer))[6]) << (sizeof(bitD->bitContainer)*8 - 16);
                ZSTD_FALLTHROUGH;

        case 6: bitD->bitContainer += (BitContainerType)(((const BYTE*)(srcBuffer))[5]) << (sizeof(bitD->bitContainer)*8 - 24);
                ZSTD_FALLTHROUGH;

        case 5: bitD->bitContainer += (BitContainerType)(((const BYTE*)(srcBuffer))[4]) << (sizeof(bitD->bitContainer)*8 - 32);
                ZSTD_FALLTHROUGH;

        case 4: bitD->bitContainer += (BitContainerType)(((const BYTE*)(srcBuffer))[3]) << 24;
                ZSTD_FALLTHROUGH;

        case 3: bitD->bitContainer += (BitContainerType)(((const BYTE*)(srcBuffer))[2]) << 16;
                ZSTD_FALLTHROUGH;

        case 2: bitD->bitContainer += (BitContainerType)(((const BYTE*)(srcBuffer))[1]) <<  8;
                ZSTD_FALLTHROUGH;

        default: break;
        }
        {   BYTE const lastByte = ((const BYTE*)srcBuffer)[srcSize-1];
            bitD->bitsConsumed = lastByte ? 8 - ZSTD_highbit32(lastByte) : 0;
            if (lastByte == 0) return ERROR(corruption_detected);  /* endMark not present */
        }
        bitD->bitsConsumed += (U32)(sizeof(bitD->bitContainer) - srcSize)*8;
    }

    return srcSize;
}